

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall
duckdb::StringValueResult::AddValueToVector
          (StringValueResult *this,char *value_ptr,idx_t size,bool allocate)

{
  idx_t *col_idx;
  idx_t *piVar1;
  ParseTypeInfo *pPVar2;
  undefined8 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  PhysicalType PVar6;
  CSVStateMachine *pCVar7;
  _Head_base<0UL,_const_char_**,_false> _Var8;
  char *pcVar9;
  _Head_base<0UL,_duckdb::ParseTypeInfo_*,_false> _Var10;
  CSVReaderOptions *pCVar11;
  ValidityMask *pVVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppvVar13;
  void *pvVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  bool bVar22;
  bool bVar23;
  DateCastResult DVar24;
  const_reference cVar25;
  ulong uVar26;
  TemplatedValidityData<unsigned_long> *pTVar27;
  _Head_base<0UL,_unsigned_long_*,_false> _Var28;
  reference pvVar29;
  ostream *poVar30;
  reference pvVar31;
  InvalidInputException *this_01;
  InternalException *pIVar32;
  uint uVar33;
  ulong uVar34;
  timestamp_t *result;
  idx_t *piVar35;
  byte bVar36;
  PhysicalType type_00;
  PhysicalType type_01;
  LogicalTypeId type;
  idx_t iVar37;
  long lVar38;
  char strict;
  _Head_base<0UL,_unsigned_long_*,_false> in_R8;
  idx_t iVar39;
  ulong uVar40;
  anon_union_16_2_67f50693_for_value aVar41;
  string_t data;
  bool special;
  string strip_thousands;
  idx_t pos;
  string local_238;
  uint local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  _Head_base<0UL,_unsigned_long_*,_false> local_208;
  char *local_200;
  duckdb local_1f8 [16];
  string local_1e8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  bVar23 = HandleTooManyColumnsError(this,value_ptr,size);
  if (bVar23) {
    return;
  }
  col_idx = &this->cur_col_id;
  uVar34 = this->cur_col_id;
  uVar26 = (ulong)this->number_of_columns;
  if (uVar26 <= uVar34) {
    pCVar7 = (this->super_ScannerResult).state_machine;
    if ((pCVar7->state_machine_options).strict_mode.value != true) {
      return;
    }
    if ((uVar34 == uVar26) &&
       ((((this->super_ScannerResult).quoted != true ||
         (pCVar7->options->allow_quoted_nulls == true)) &&
        (iVar39 = this->null_str_count, iVar39 != 0)))) {
      bVar23 = false;
      iVar37 = 0;
      do {
        while ((bVar22 = true, bVar23 || (size == 0))) {
LAB_00d13be1:
          bVar23 = bVar22;
          iVar37 = iVar37 + 1;
          if (iVar37 == iVar39) {
            if (bVar23) {
              return;
            }
            goto LAB_00d13e44;
          }
        }
        pcVar9 = (this->null_str_ptr).
                 super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl[iVar37];
        if (*pcVar9 == *value_ptr) {
          uVar34 = 1;
          do {
            uVar26 = uVar34;
            if (size == uVar26) break;
            uVar34 = uVar26 + 1;
          } while (pcVar9[uVar26] == value_ptr[uVar26]);
          bVar22 = size <= uVar26;
          goto LAB_00d13be1;
        }
        iVar37 = iVar37 + 1;
        bVar23 = false;
      } while (iVar37 != iVar39);
    }
LAB_00d13e44:
    local_1a8[0]._M_dataplus._M_p._0_4_ = CONCAT31(local_1a8[0]._M_dataplus._M_p._1_3_,3);
    LineError::Insert(&this->current_errors,(CSVErrorType *)local_1a8,col_idx,&this->chunk_col_id,
                      &(this->super_ScannerResult).last_position,0);
    this->cur_col_id = this->cur_col_id + 1;
    return;
  }
  if ((this->projecting_columns == true) &&
     ((this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar34] == false)) {
    *col_idx = uVar34 + 1;
    return;
  }
  bVar23 = (this->super_ScannerResult).quoted;
  pCVar7 = (this->super_ScannerResult).state_machine;
  if ((bVar23 != true) || (pCVar7->options->allow_quoted_nulls == true)) {
    if (((pCVar7->state_machine_options).strict_mode.value == false) &&
       ((this->super_ScannerResult).escaped == true)) {
      bVar36 = (bVar23 ^ 1U) & size == 1;
    }
    else {
      bVar36 = 0;
    }
    if (this->null_str_count != 0) {
      _Var8._M_head_impl =
           (this->null_str_ptr).
           super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
           super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
           super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      in_R8._M_head_impl =
           (this->null_str_size).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      iVar39 = 0;
      do {
        if ((in_R8._M_head_impl[iVar39] == 2) &&
           (pcVar9 = _Var8._M_head_impl[iVar39],
           *pcVar9 == (pCVar7->state_machine_options).escape.value)) {
          if ((bVar36 != 0) && (pcVar9[1] == *value_ptr)) goto LAB_00d13dc0;
        }
        else if (in_R8._M_head_impl[iVar39] == size && bVar36 == 0) {
          if (size == 0) {
LAB_00d13dc0:
            piVar1 = &this->chunk_col_id;
            uVar34 = this->chunk_col_id;
            pCVar11 = pCVar7->options;
            if (uVar34 < (ulong)*(uint *)((long)&(pCVar11->force_not_null).
                                                 super_vector<bool,_std::allocator<bool>_>.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_finish.
                                                 super__Bit_iterator_base + 8) +
                         ((long)(pCVar11->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)(pCVar11->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8)
            {
              cVar25 = vector<bool,_true>::get<true>(&pCVar11->force_not_null,uVar34);
              uVar34 = *piVar1;
              if (cVar25) {
                if (*(LogicalTypeId *)
                     ((long)((this->parse_types).
                             super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                             .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl +
                            uVar34) + 1) == VARCHAR) {
                  puVar3 = (undefined8 *)
                           ((long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar34] +
                           this->number_of_rows * 0x10);
                  *puVar3 = 0;
                  puVar3[1] = 0;
                }
                else {
                  local_1a8[0]._M_dataplus._M_p._0_4_ =
                       (uint)local_1a8[0]._M_dataplus._M_p & 0xffffff00;
                  LineError::Insert(&this->current_errors,(CSVErrorType *)local_1a8,col_idx,piVar1,
                                    &(this->super_ScannerResult).last_position,0);
                }
                goto LAB_00d1425e;
              }
              uVar26 = (ulong)this->number_of_columns;
            }
            if (uVar34 == uVar26) {
              return;
            }
            uVar26 = this->number_of_rows;
            pVVar12 = (this->validity_mask).
                      super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                      super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar34];
            _Var28._M_head_impl =
                 (pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (_Var28._M_head_impl == (unsigned_long *)0x0) {
              local_208._M_head_impl =
                   (unsigned_long *)(pVVar12->super_TemplatedValidityMask<unsigned_long>).capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_1a8,(unsigned_long *)&local_208);
              uVar16 = CONCAT44(local_1a8[0]._M_dataplus._M_p._4_4_,
                                (uint)local_1a8[0]._M_dataplus._M_p);
              p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        CONCAT44(local_1a8[0]._M_string_length._4_4_,
                                 (undefined4)local_1a8[0]._M_string_length);
              local_1a8[0]._M_dataplus._M_p._0_4_ = 0;
              local_1a8[0]._M_dataplus._M_p._4_4_ = 0;
              local_1a8[0]._M_string_length._0_4_ = 0;
              local_1a8[0]._M_string_length._4_4_ = 0;
              this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_data
                        + 8))->_M_pi;
              (pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)uVar16;
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_data + 8))->
              _M_pi = p_Var17;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT44(local_1a8[0]._M_string_length._4_4_,
                             (undefined4)local_1a8[0]._M_string_length) !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             CONCAT44(local_1a8[0]._M_string_length._4_4_,
                                      (undefined4)local_1a8[0]._M_string_length));
                }
              }
              pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(pVVar12->super_TemplatedValidityMask<unsigned_long>).
                                    validity_data);
              _Var28._M_head_impl =
                   (pTVar27->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                   _Var28._M_head_impl;
            }
            bVar36 = (byte)uVar26 & 0x3f;
            _Var28._M_head_impl[uVar26 >> 6] =
                 _Var28._M_head_impl[uVar26 >> 6] &
                 (-2L << bVar36 | 0xfffffffffffffffeU >> 0x40 - bVar36);
LAB_00d1425e:
            *col_idx = *col_idx + 1;
            *piVar1 = *piVar1 + 1;
            return;
          }
          pcVar9 = _Var8._M_head_impl[iVar39];
          if (*pcVar9 == *value_ptr) {
            uVar34 = 1;
            do {
              uVar40 = uVar34;
              if (size == uVar40) break;
              uVar34 = uVar40 + 1;
            } while (pcVar9[uVar40] == value_ptr[uVar40]);
            if (size <= uVar40) goto LAB_00d13dc0;
          }
        }
        iVar39 = iVar39 + 1;
      } while (iVar39 != this->null_str_count);
    }
  }
  strict = (char)in_R8._M_head_impl;
  local_208._M_head_impl = (unsigned_long *)local_1f8;
  local_200 = (char *)0x0;
  local_1f8[0] = (duckdb)0x0;
  bVar23 = LogicalType::IsNumeric
                     (*(LogicalTypeId *)
                       ((long)((this->parse_types).
                               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl +
                              this->chunk_col_id) + 1));
  if ((bVar23) &&
     (cVar5 = ((this->super_ScannerResult).state_machine)->options->thousands_separator,
     cVar5 != '\0')) {
    BaseScanner::RemoveSeparator_abi_cxx11_
              (local_1a8,(BaseScanner *)value_ptr,(char *)size,(ulong)(uint)(int)cVar5,strict);
    ::std::__cxx11::string::operator=((string *)&local_208,(string *)local_1a8);
    value_ptr = (char *)local_208._M_head_impl;
    size = (idx_t)local_200;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a8[0]._M_dataplus._M_p._4_4_,(uint)local_1a8[0]._M_dataplus._M_p) !=
        &local_1a8[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1a8[0]._M_dataplus._M_p._4_4_,
                               (uint)local_1a8[0]._M_dataplus._M_p));
      value_ptr = (char *)local_208._M_head_impl;
      size = (idx_t)local_200;
    }
  }
  piVar1 = &this->chunk_col_id;
  _Var10._M_head_impl =
       (this->parse_types).
       super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t
       .super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
       .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
  iVar39 = this->chunk_col_id;
  pPVar2 = _Var10._M_head_impl + iVar39;
  uVar33 = *(LogicalTypeId *)((long)(_Var10._M_head_impl + iVar39) + 1) - 10;
  uVar26 = (ulong)uVar33;
  uVar34 = uVar26;
  if (0x16 < uVar33) {
switchD_00d13d65_caseD_11:
    uVar33 = (uint)size;
    if ((pPVar2->validate_utf8 != true) ||
       (bVar23 = Utf8Proc::IsValid(value_ptr,size & 0xffffffff), bVar23)) {
      uVar20 = (undefined4)local_1a8[0]._M_string_length;
      uVar18 = local_1a8[0]._M_dataplus._M_p._4_4_;
      local_1a8[0]._M_dataplus._M_p._4_4_ = SUB84(value_ptr,0);
      uVar19 = local_1a8[0]._M_dataplus._M_p._4_4_;
      local_1a8[0]._M_string_length._0_4_ = (undefined4)((ulong)value_ptr >> 0x20);
      uVar21 = (undefined4)local_1a8[0]._M_string_length;
      if (!allocate) {
        if (uVar33 < 0xd) {
          local_1a8[0]._M_string_length._0_4_ = 0;
          local_1a8[0]._M_dataplus._M_p._0_4_ = 0;
          local_1a8[0]._M_dataplus._M_p._4_4_ = 0;
          if (uVar33 != 0) {
            switchD_00b03519::default(local_1a8,value_ptr,(ulong)(uVar33 & 0xf));
          }
        }
        else {
          local_1a8[0]._M_dataplus._M_p._0_4_ = *(uint *)value_ptr;
        }
        pvVar14 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start[this->chunk_col_id];
        lVar38 = this->number_of_rows * 0x10;
        *(uint *)((long)pvVar14 + lVar38) = uVar33;
        *(ulong *)((long)pvVar14 + lVar38 + 4) =
             CONCAT44(local_1a8[0]._M_dataplus._M_p._4_4_,(uint)local_1a8[0]._M_dataplus._M_p);
        *(undefined4 *)((long)pvVar14 + lVar38 + 0xc) = (undefined4)local_1a8[0]._M_string_length;
        goto LAB_00d146e6;
      }
      local_1a8[0]._M_dataplus._M_p._4_4_ = uVar18;
      local_1a8[0]._M_string_length._0_4_ = uVar20;
      pvVar29 = vector<duckdb::Vector,_true>::operator[]
                          (&(this->parse_chunk).data,this->chunk_col_id);
      local_218 = uVar33;
      if (uVar33 < 0xd) {
        uStack_20c = 0;
        uStack_214 = 0;
        uStack_210 = 0;
        if (uVar33 == 0) {
          value_ptr = (char *)0x0;
        }
        else {
          switchD_00b03519::default(&uStack_214,value_ptr,(ulong)(uVar33 & 0xf));
          value_ptr = (char *)CONCAT44(uStack_20c,uStack_210);
        }
      }
      else {
        uStack_214 = *(undefined4 *)value_ptr;
        uStack_210 = uVar19;
        uStack_20c = uVar21;
      }
      data.value.pointer.ptr = (char *)uVar34;
      data.value._0_8_ = value_ptr;
      aVar41.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)pvVar29,(Vector *)CONCAT44(uStack_214,local_218),data);
    }
    else {
      if (((((this->super_ScannerResult).state_machine)->options->ignore_errors).value == false) &&
         ((this->sniffing & 1U) != 0)) {
        HandleUnicodeError(this,this->cur_col_id,&(this->super_ScannerResult).last_position);
      }
      local_1a8[0]._M_dataplus._M_p._0_4_ = CONCAT31(local_1a8[0]._M_dataplus._M_p._1_3_,8);
      piVar35 = piVar1;
      LineError::Insert(&this->current_errors,(CSVErrorType *)local_1a8,col_idx,piVar1,
                        &(this->super_ScannerResult).last_position,0);
      pvVar29 = vector<duckdb::Vector,_true>::operator[]
                          (&(this->parse_chunk).data,this->chunk_col_id);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = piVar35;
      aVar41.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)pvVar29,(Vector *)0x0,(string_t)(auVar15 << 0x40));
    }
    pvVar14 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
              _M_start[this->chunk_col_id];
    lVar38 = this->number_of_rows * 0x10;
    *(long *)((long)pvVar14 + lVar38) = aVar41._0_8_;
    *(char **)((long)pvVar14 + lVar38 + 8) = aVar41.pointer.ptr;
    goto LAB_00d146e6;
  }
  uVar34 = (long)&switchD_00d13d65::switchdataD_013925d4 +
           (long)(int)(&switchD_00d13d65::switchdataD_013925d4)[uVar26];
  switch(uVar26) {
  case 0:
    ppvVar13 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    bVar23 = TryCastStringBool(value_ptr,size,
                               (bool *)((long)ppvVar13[iVar39] + this->number_of_rows),
                               SUB81(ppvVar13,0));
    break;
  case 1:
    ppvVar13 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    bVar23 = TrySimpleIntegerCast<signed_char,true>
                       (value_ptr,size,(char *)((long)ppvVar13[iVar39] + this->number_of_rows),
                        SUB81(ppvVar13,0));
    break;
  case 2:
    ppvVar13 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    bVar23 = TrySimpleIntegerCast<short,true>
                       ((duckdb *)value_ptr,(char *)size,
                        (idx_t)(this->number_of_rows * 2 + (long)ppvVar13[iVar39]),(short *)ppvVar13
                        ,(bool)strict);
    break;
  case 3:
    ppvVar13 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    bVar23 = TrySimpleIntegerCast<int,true>
                       (value_ptr,size,(int *)(this->number_of_rows * 4 + (long)ppvVar13[iVar39]),
                        SUB81(ppvVar13,0));
    break;
  case 4:
    ppvVar13 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    bVar23 = TrySimpleIntegerCast<long,true>
                       (value_ptr,size,(long *)(this->number_of_rows * 8 + (long)ppvVar13[iVar39]),
                        SUB81(ppvVar13,0));
    break;
  case 5:
    bVar23 = StrTimeFormat::Empty(&(this->date_format).super_StrTimeFormat);
    if (!bVar23) {
      bVar23 = StrpTimeFormat::TryParseDate
                         (&this->date_format,value_ptr,size,
                          (date_t *)
                          (this->number_of_rows * 4 +
                          (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start[this->chunk_col_id]));
      break;
    }
    DVar24 = Date::TryConvertDate
                       (value_ptr,size,(idx_t *)local_1a8,
                        (date_t *)
                        (this->number_of_rows * 4 +
                        (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start[this->chunk_col_id]),
                        (bool *)&local_238,false);
LAB_00d13fe1:
    if (DVar24 == SUCCESS) goto LAB_00d146e6;
    goto LAB_00d1452d;
  case 6:
    bVar23 = Time::TryConvertTime
                       (value_ptr,size,(idx_t *)local_1a8,
                        (dtime_t *)
                        (this->number_of_rows * 8 +
                        (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar39]),false,
                        (optional_ptr<int,_true>)0x0);
    break;
  default:
    goto switchD_00d13d65_caseD_11;
  case 9:
  case 0x16:
    bVar23 = StrTimeFormat::Empty(&(this->timestamp_format).super_StrTimeFormat);
    result = (timestamp_t *)
             (this->number_of_rows * 8 +
             (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start[this->chunk_col_id]);
    if (bVar23) {
      DVar24 = Timestamp::TryConvertTimestamp
                         (value_ptr,size,result,(optional_ptr<int,_true>)0x0,false);
      goto LAB_00d13fe1;
    }
    bVar23 = StrpTimeFormat::TryParseTimestamp(&this->timestamp_format,value_ptr,size,result);
    break;
  case 0xb:
    if (this->decimal_separator == '.') {
      PVar6 = pPVar2->internal_type;
      if (PVar6 < INT64) {
        if (PVar6 == INT16) {
          bVar23 = TryDecimalStringCast<short,(char)46>
                             (value_ptr,size,
                              (short *)(this->number_of_rows * 2 +
                                       (long)(this->vector_ptr).
                                             super_vector<void_*,_std::allocator<void_*>_>.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start[iVar39]),
                              pPVar2->width,pPVar2->scale);
        }
        else {
          if (PVar6 != INT32) {
LAB_00d147aa:
            pIVar32 = (InternalException *)__cxa_allocate_exception(0x10);
            TypeIdToString_abi_cxx11_
                      (&local_238,
                       (duckdb *)
                       (ulong)*(PhysicalType *)
                               ((long)((this->parse_types).
                                       super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                       .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>.
                                       _M_head_impl + this->chunk_col_id) + 2),type_00);
            ::std::operator+(local_1a8,"Invalid Physical Type for Decimal Value. Physical Type: ",
                             &local_238);
            InternalException::InternalException(pIVar32,local_1a8);
            __cxa_throw(pIVar32,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar23 = TryDecimalStringCast<int,(char)46>
                             (value_ptr,size,
                              (int *)(this->number_of_rows * 4 +
                                     (long)(this->vector_ptr).
                                           super_vector<void_*,_std::allocator<void_*>_>.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start[iVar39]),
                              pPVar2->width,pPVar2->scale);
        }
      }
      else if (PVar6 == INT64) {
        bVar23 = TryDecimalStringCast<long,(char)46>
                           (value_ptr,size,
                            (long *)(this->number_of_rows * 8 +
                                    (long)(this->vector_ptr).
                                          super_vector<void_*,_std::allocator<void_*>_>.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start[iVar39]),
                            pPVar2->width,pPVar2->scale);
      }
      else {
        if (PVar6 != INT128) goto LAB_00d147aa;
        bVar23 = TryDecimalStringCast<duckdb::hugeint_t,(char)46>
                           (value_ptr,size,
                            (hugeint_t *)
                            (this->number_of_rows * 0x10 +
                            (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar39]),pPVar2->width,
                            pPVar2->scale);
      }
    }
    else {
      if (this->decimal_separator != ',') {
        this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Decimals can only have \',\' and \'.\' as decimal separators","");
        InvalidInputException::InvalidInputException(this_01,local_1a8);
        __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      PVar6 = pPVar2->internal_type;
      if (PVar6 < INT64) {
        if (PVar6 == INT16) {
          bVar23 = TryDecimalStringCast<short,(char)44>
                             (value_ptr,size,
                              (short *)(this->number_of_rows * 2 +
                                       (long)(this->vector_ptr).
                                             super_vector<void_*,_std::allocator<void_*>_>.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start[iVar39]),
                              pPVar2->width,pPVar2->scale);
        }
        else {
          if (PVar6 != INT32) {
LAB_00d1481e:
            pIVar32 = (InternalException *)__cxa_allocate_exception(0x10);
            TypeIdToString_abi_cxx11_
                      (&local_238,
                       (duckdb *)
                       (ulong)*(PhysicalType *)
                               ((long)((this->parse_types).
                                       super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                       .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>.
                                       _M_head_impl + this->chunk_col_id) + 2),type_01);
            ::std::operator+(local_1a8,"Invalid Physical Type for Decimal Value. Physical Type: ",
                             &local_238);
            InternalException::InternalException(pIVar32,local_1a8);
            __cxa_throw(pIVar32,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar23 = TryDecimalStringCast<int,(char)44>
                             (value_ptr,size,
                              (int *)(this->number_of_rows * 4 +
                                     (long)(this->vector_ptr).
                                           super_vector<void_*,_std::allocator<void_*>_>.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start[iVar39]),
                              pPVar2->width,pPVar2->scale);
        }
      }
      else if (PVar6 == INT64) {
        bVar23 = TryDecimalStringCast<long,(char)44>
                           (value_ptr,size,
                            (long *)(this->number_of_rows * 8 +
                                    (long)(this->vector_ptr).
                                          super_vector<void_*,_std::allocator<void_*>_>.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start[iVar39]),
                            pPVar2->width,pPVar2->scale);
      }
      else {
        if (PVar6 != INT128) goto LAB_00d1481e;
        bVar23 = TryDecimalStringCast<duckdb::hugeint_t,(char)44>
                           (value_ptr,size,
                            (hugeint_t *)
                            (this->number_of_rows * 0x10 +
                            (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar39]),pPVar2->width,
                            pPVar2->scale);
      }
    }
    break;
  case 0xc:
    bVar23 = TryDoubleCast<float>
                       (value_ptr,size,
                        (float *)(this->number_of_rows * 4 +
                                 (long)(this->vector_ptr).
                                       super_vector<void_*,_std::allocator<void_*>_>.
                                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                       super__Vector_impl_data._M_start[iVar39]),
                        (bool)*(((this->super_ScannerResult).state_machine)->options->
                               decimal_separator)._M_dataplus._M_p,strict);
    break;
  case 0xd:
    bVar23 = TryDoubleCast<double>
                       (value_ptr,size,
                        (double *)
                        (this->number_of_rows * 8 +
                        (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar39]),
                        (bool)*(((this->super_ScannerResult).state_machine)->options->
                               decimal_separator)._M_dataplus._M_p,strict);
    break;
  case 0x12:
    ppvVar13 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    bVar23 = TrySimpleIntegerCast<unsigned_char,false>
                       (value_ptr,size,(uchar *)((long)ppvVar13[iVar39] + this->number_of_rows),
                        SUB81(ppvVar13,0));
    break;
  case 0x13:
    ppvVar13 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    bVar23 = TrySimpleIntegerCast<unsigned_short,false>
                       (value_ptr,size,
                        (unsigned_short *)(this->number_of_rows * 2 + (long)ppvVar13[iVar39]),
                        SUB81(ppvVar13,0));
    break;
  case 0x14:
    ppvVar13 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    bVar23 = TrySimpleIntegerCast<unsigned_int,false>
                       (value_ptr,size,(uint *)(this->number_of_rows * 4 + (long)ppvVar13[iVar39]),
                        SUB81(ppvVar13,0));
    break;
  case 0x15:
    ppvVar13 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    bVar23 = TrySimpleIntegerCast<unsigned_long,false>
                       (value_ptr,size,
                        (unsigned_long *)(this->number_of_rows * 8 + (long)ppvVar13[iVar39]),
                        SUB81(ppvVar13,0));
  }
  if (bVar23 == false) {
LAB_00d1452d:
    local_1a8[0]._M_dataplus._M_p._0_4_ = (uint)local_1a8[0]._M_dataplus._M_p & 0xffffff00;
    LineError::Insert(&this->current_errors,(CSVErrorType *)local_1a8,col_idx,piVar1,
                      &(this->super_ScannerResult).last_position,0);
    bVar23 = CSVReaderOptions::IgnoreErrors(((this->super_ScannerResult).state_machine)->options);
    if (!bVar23) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Could not convert string \"",0x1a);
      paVar4 = &local_238.field_2;
      local_238._M_dataplus._M_p = (pointer)paVar4;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,value_ptr,(char *)(size + (long)value_ptr));
      poVar30 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar30,"\" to \'",6);
      LogicalTypeIdToString_abi_cxx11_
                (&local_1e8,
                 (duckdb *)
                 (ulong)*(LogicalTypeId *)
                         ((long)((this->parse_types).
                                 super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                 .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl
                                + this->chunk_col_id) + 1),type);
      poVar30 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar30,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar30,"\'",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar4) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      ::std::__cxx11::stringbuf::str();
      FullLinePosition::SanitizeError(&local_238);
      local_1c8[0] = local_1b8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,local_238._M_dataplus._M_p,
                 local_238._M_dataplus._M_p + local_238._M_string_length);
      pvVar31 = vector<duckdb::CurrentError,_true>::back(&(this->current_errors).current_errors);
      ::std::__cxx11::string::operator=((string *)&pvVar31->error_message,(string *)local_1c8);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar4) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      ::std::ios_base::~ios_base(local_138);
    }
  }
LAB_00d146e6:
  *col_idx = *col_idx + 1;
  *piVar1 = *piVar1 + 1;
  if ((duckdb *)local_208._M_head_impl != local_1f8) {
    operator_delete(local_208._M_head_impl);
  }
  return;
}

Assistant:

void StringValueResult::AddValueToVector(const char *value_ptr, idx_t size, bool allocate) {
	if (HandleTooManyColumnsError(value_ptr, size)) {
		return;
	}
	if (cur_col_id >= number_of_columns) {
		if (!state_machine.state_machine_options.strict_mode.GetValue()) {
			return;
		}
		bool error = true;
		if (cur_col_id == number_of_columns && ((quoted && state_machine.options.allow_quoted_nulls) || !quoted)) {
			// we make an exception if the first over-value is null
			bool is_value_null = false;
			for (idx_t i = 0; i < null_str_count; i++) {
				is_value_null = is_value_null || IsValueNull(null_str_ptr[i], value_ptr, size);
			}
			error = !is_value_null;
		}
		if (error) {
			// We error pointing to the current value error.
			current_errors.Insert(TOO_MANY_COLUMNS, cur_col_id, chunk_col_id, last_position);
			cur_col_id++;
		}
		return;
	}

	if (projecting_columns) {
		if (!projected_columns[cur_col_id]) {
			cur_col_id++;
			return;
		}
	}

	if (((quoted && state_machine.options.allow_quoted_nulls) || !quoted)) {
		// Check for the occurrence of escaped null string like \N only if strict_mode is disabled
		const bool check_unquoted_escaped_null =
		    state_machine.state_machine_options.strict_mode.GetValue() == false && escaped && !quoted && size == 1;
		for (idx_t i = 0; i < null_str_count; i++) {
			bool is_null = false;
			if (null_str_size[i] == 2 && null_str_ptr[i][0] == state_machine.state_machine_options.escape.GetValue()) {
				is_null = check_unquoted_escaped_null && null_str_ptr[i][1] == value_ptr[0];
			} else if (size == null_str_size[i] && !check_unquoted_escaped_null) {
				is_null = IsValueNull(null_str_ptr[i], value_ptr, size);
			}
			if (is_null) {
				bool empty = false;
				if (chunk_col_id < state_machine.options.force_not_null.size()) {
					empty = state_machine.options.force_not_null[chunk_col_id];
				}
				if (empty) {
					if (parse_types[chunk_col_id].type_id != LogicalTypeId::VARCHAR) {
						// If it is not a varchar, empty values are not accepted, we must error.
						current_errors.Insert(CAST_ERROR, cur_col_id, chunk_col_id, last_position);
					} else {
						static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = string_t();
					}
				} else {
					if (chunk_col_id == number_of_columns) {
						// We check for a weird case, where we ignore an extra value, if it is a null value
						return;
					}
					validity_mask[chunk_col_id]->SetInvalid(static_cast<idx_t>(number_of_rows));
				}
				cur_col_id++;
				chunk_col_id++;
				return;
			}
		}
	}
	bool success = true;
	string strip_thousands;
	if (LogicalType::IsNumeric(parse_types[chunk_col_id].type_id) &&
	    state_machine.options.thousands_separator != '\0') {
		// If we have a thousands separator we should try to use that
		strip_thousands = BaseScanner::RemoveSeparator(value_ptr, size, state_machine.options.thousands_separator);
		value_ptr = strip_thousands.c_str();
		size = strip_thousands.size();
	}
	switch (parse_types[chunk_col_id].type_id) {
	case LogicalTypeId::BOOLEAN:
		success =
		    TryCastStringBool(value_ptr, size, static_cast<bool *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::TINYINT:
		success = TrySimpleIntegerCast(value_ptr, size, static_cast<int8_t *>(vector_ptr[chunk_col_id])[number_of_rows],
		                               false);
		break;
	case LogicalTypeId::SMALLINT:
		success = TrySimpleIntegerCast(value_ptr, size,
		                               static_cast<int16_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::INTEGER:
		success = TrySimpleIntegerCast(value_ptr, size,
		                               static_cast<int32_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::BIGINT:
		success = TrySimpleIntegerCast(value_ptr, size,
		                               static_cast<int64_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::UTINYINT:
		success = TrySimpleIntegerCast<uint8_t, false>(
		    value_ptr, size, static_cast<uint8_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::USMALLINT:
		success = TrySimpleIntegerCast<uint16_t, false>(
		    value_ptr, size, static_cast<uint16_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::UINTEGER:
		success = TrySimpleIntegerCast<uint32_t, false>(
		    value_ptr, size, static_cast<uint32_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::UBIGINT:
		success = TrySimpleIntegerCast<uint64_t, false>(
		    value_ptr, size, static_cast<uint64_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::DOUBLE:
		success =
		    TryDoubleCast<double>(value_ptr, size, static_cast<double *>(vector_ptr[chunk_col_id])[number_of_rows],
		                          false, state_machine.options.decimal_separator[0]);
		break;
	case LogicalTypeId::FLOAT:
		success = TryDoubleCast<float>(value_ptr, size, static_cast<float *>(vector_ptr[chunk_col_id])[number_of_rows],
		                               false, state_machine.options.decimal_separator[0]);
		break;
	case LogicalTypeId::DATE: {
		if (!date_format.Empty()) {
			success = date_format.TryParseDate(value_ptr, size,
			                                   static_cast<date_t *>(vector_ptr[chunk_col_id])[number_of_rows]);
		} else {
			idx_t pos;
			bool special;
			success = Date::TryConvertDate(value_ptr, size, pos,
			                               static_cast<date_t *>(vector_ptr[chunk_col_id])[number_of_rows], special,
			                               false) == DateCastResult::SUCCESS;
		}
		break;
	}
	case LogicalTypeId::TIME: {
		idx_t pos;
		success = Time::TryConvertTime(value_ptr, size, pos,
		                               static_cast<dtime_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	}
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ: {
		if (!timestamp_format.Empty()) {
			success = timestamp_format.TryParseTimestamp(
			    value_ptr, size, static_cast<timestamp_t *>(vector_ptr[chunk_col_id])[number_of_rows]);
		} else {
			success = Timestamp::TryConvertTimestamp(
			              value_ptr, size, static_cast<timestamp_t *>(vector_ptr[chunk_col_id])[number_of_rows]) ==
			          TimestampCastResult::SUCCESS;
		}
		break;
	}
	case LogicalTypeId::DECIMAL: {
		if (decimal_separator == ',') {
			switch (parse_types[chunk_col_id].internal_type) {
			case PhysicalType::INT16:
				success = TryDecimalStringCast<int16_t, ','>(
				    value_ptr, size, static_cast<int16_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT32:
				success = TryDecimalStringCast<int32_t, ','>(
				    value_ptr, size, static_cast<int32_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT64:
				success = TryDecimalStringCast<int64_t, ','>(
				    value_ptr, size, static_cast<int64_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT128:
				success = TryDecimalStringCast<hugeint_t, ','>(
				    value_ptr, size, static_cast<hugeint_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(parse_types[chunk_col_id].internal_type));
			}

		} else if (decimal_separator == '.') {
			switch (parse_types[chunk_col_id].internal_type) {
			case PhysicalType::INT16:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<int16_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT32:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<int32_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT64:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<int64_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT128:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<hugeint_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(parse_types[chunk_col_id].internal_type));
			}
		} else {
			throw InvalidInputException("Decimals can only have ',' and '.' as decimal separators");
		}
		break;
	}
	default: {
		// By default, we add a string
		// We only evaluate if a string is utf8 valid, if it's actually a varchar
		if (parse_types[chunk_col_id].validate_utf8 &&
		    !Utf8Proc::IsValid(value_ptr, UnsafeNumericCast<uint32_t>(size))) {
			bool force_error = !state_machine.options.ignore_errors.GetValue() && sniffing;
			// Invalid unicode, we must error
			if (force_error) {
				HandleUnicodeError(cur_col_id, last_position);
			}
			// If we got here, we are ignoring errors, hence we must ignore this line.
			current_errors.Insert(INVALID_ENCODING, cur_col_id, chunk_col_id, last_position);
			static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = StringVector::AddStringOrBlob(
			    parse_chunk.data[chunk_col_id], string_t(value_ptr, UnsafeNumericCast<uint32_t>(0)));
			break;
		}
		if (allocate) {
			// If it's a value produced over multiple buffers, we must allocate
			static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = StringVector::AddStringOrBlob(
			    parse_chunk.data[chunk_col_id], string_t(value_ptr, UnsafeNumericCast<uint32_t>(size)));
		} else {
			static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] =
			    string_t(value_ptr, UnsafeNumericCast<uint32_t>(size));
		}
		break;
	}
	}
	if (!success) {
		current_errors.Insert(CAST_ERROR, cur_col_id, chunk_col_id, last_position);
		if (!state_machine.options.IgnoreErrors()) {
			// We have to write the cast error message.
			std::ostringstream error;
			// Casting Error Message
			error << "Could not convert string \"" << std::string(value_ptr, size) << "\" to \'"
			      << LogicalTypeIdToString(parse_types[chunk_col_id].type_id) << "\'";
			auto error_string = error.str();
			FullLinePosition::SanitizeError(error_string);

			current_errors.ModifyErrorMessageOfLastError(error_string);
		}
	}
	cur_col_id++;
	chunk_col_id++;
}